

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

bool btRayAabb(btVector3 *rayFrom,btVector3 *rayTo,btVector3 *aabbMin,btVector3 *aabbMax,
              btScalar *param,btVector3 *normal)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  btScalar bVar14;
  btScalar bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  btVector3 aabbHalfExtent;
  btVector3 source;
  undefined8 local_28;
  undefined8 uStack_20;
  btVector3 r;
  
  fVar9 = (aabbMax->m_floats[2] - aabbMin->m_floats[2]) * 0.5;
  aabbHalfExtent.m_floats[2] = (btScalar)(int)(ulong)(uint)fVar9;
  aabbHalfExtent.m_floats[3] = (btScalar)(int)((ulong)(uint)fVar9 >> 0x20);
  fVar7 = (aabbMax->m_floats[2] + aabbMin->m_floats[2]) * 0.5;
  fVar8 = rayFrom->m_floats[2] - fVar7;
  source.m_floats[2] = (btScalar)(int)(ulong)(uint)fVar8;
  source.m_floats[3] = (btScalar)(int)((ulong)(uint)fVar8 >> 0x20);
  fVar7 = rayTo->m_floats[2] - fVar7;
  fVar16 = (float)*(undefined8 *)aabbMax->m_floats;
  fVar18 = (float)((ulong)*(undefined8 *)aabbMax->m_floats >> 0x20);
  fVar17 = (float)*(undefined8 *)aabbMin->m_floats;
  fVar19 = (float)((ulong)*(undefined8 *)aabbMin->m_floats >> 0x20);
  fVar10 = (fVar16 - fVar17) * 0.5;
  fVar12 = (fVar18 - fVar19) * 0.5;
  aabbHalfExtent.m_floats[0] = fVar10;
  aabbHalfExtent.m_floats[1] = fVar12;
  fVar17 = (fVar16 + fVar17) * 0.5;
  fVar19 = (fVar18 + fVar19) * 0.5;
  fVar11 = (float)*(undefined8 *)rayFrom->m_floats - fVar17;
  fVar13 = (float)((ulong)*(undefined8 *)rayFrom->m_floats >> 0x20) - fVar19;
  source.m_floats[0] = fVar11;
  source.m_floats[1] = fVar13;
  fVar17 = (float)*(undefined8 *)rayTo->m_floats - fVar17;
  fVar19 = (float)((ulong)*(undefined8 *)rayTo->m_floats >> 0x20) - fVar19;
  bVar2 = (fVar9 < fVar8) << 5 |
          ((fVar12 < fVar13) << 4 |
          (fVar11 < -fVar10) + (fVar10 < fVar11) * '\b' + (fVar13 < -fVar12) * '\x02') +
          (fVar8 < -fVar9) * '\x04';
  bVar3 = (fVar9 < fVar7) << 5 |
          ((fVar12 < fVar19) << 4 |
          (fVar17 < -fVar10) + (fVar10 < fVar17) * '\b' + (fVar19 < -fVar12) * '\x02') +
          (fVar7 < -fVar9) * '\x04';
  if ((bVar2 & bVar3) != 0) {
    return false;
  }
  bVar15 = *param;
  r.m_floats[0] = fVar17 - fVar11;
  r.m_floats[1] = fVar19 - fVar13;
  r.m_floats[2] = fVar7 - fVar8;
  r.m_floats[3] = 0.0;
  local_28 = 0;
  uStack_20 = 0;
  fVar7 = 0.0;
  bVar4 = 1;
  fVar17 = 1.0;
  iVar1 = 0;
  do {
    lVar5 = 0;
    bVar14 = bVar15;
    do {
      bVar15 = bVar14;
      if ((bVar4 & bVar2) == 0) {
        if (((bVar4 & bVar3) != 0) &&
           (bVar15 = (-aabbHalfExtent.m_floats[lVar5] * fVar17 - source.m_floats[lVar5]) /
                     r.m_floats[lVar5], bVar14 <= bVar15)) {
          bVar15 = bVar14;
        }
      }
      else {
        fVar19 = (-aabbHalfExtent.m_floats[lVar5] * fVar17 - source.m_floats[lVar5]) /
                 r.m_floats[lVar5];
        if (fVar7 <= fVar19) {
          local_28 = 0;
          uStack_20 = 0;
          *(float *)((long)&local_28 + lVar5 * 4) = fVar17;
          fVar7 = fVar19;
        }
      }
      bVar4 = bVar4 * '\x02';
      lVar5 = lVar5 + 1;
      bVar14 = bVar15;
    } while (lVar5 != 3);
    bVar6 = iVar1 == 0;
    fVar17 = -1.0;
    iVar1 = iVar1 + 1;
  } while (bVar6);
  if (fVar7 <= bVar15) {
    *param = fVar7;
    *(undefined8 *)normal->m_floats = local_28;
    *(undefined8 *)(normal->m_floats + 2) = uStack_20;
    return true;
  }
  return false;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator-(const btVector3& v1, const btVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API)  && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return btVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(
			v1.m_floats[0] - v2.m_floats[0],
			v1.m_floats[1] - v2.m_floats[1],
			v1.m_floats[2] - v2.m_floats[2]);
#endif
}